

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2notes.cpp
# Opt level: O1

void convertMidiFile(MidiFile *midifile,
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *matlab)

{
  byte bVar1;
  char *__s;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  value_type_conflict1 *__val;
  void *__s_00;
  void *__s_01;
  long *plVar7;
  MidiEventList *pMVar8;
  MidiEvent *pMVar9;
  ostream *poVar10;
  size_t sVar11;
  value_type_conflict1 *__val_1;
  byte bVar12;
  value_type *__val_2;
  ulong uVar13;
  long lVar14;
  vector<double,_std::allocator<double>_> event;
  vector<double,_std::allocator<double>_> local_58;
  void *local_40;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_38;
  
  local_38 = matlab;
  smf::MidiFile::absoluteTicks(midifile);
  smf::MidiFile::joinTracks(midifile);
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x40);
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 8;
  *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[3] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[4] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[5] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[6] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[7] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  __s_00 = operator_new(0x400);
  memset(__s_00,0,0x400);
  __s_01 = operator_new(0x200);
  lVar14 = 0;
  memset(__s_01,0,0x200);
  memset(__s_01,0xff,0x200);
  do {
    *(undefined8 *)((long)__s_00 + lVar14 * 8) = 0xbff0000000000000;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x80);
  local_40 = __s_01;
  if (verboseQ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-1\ttpq\t",7);
    iVar4 = smf::MidiFile::getTicksPerQuarterNote(midifile);
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
  }
  iVar4 = 0;
  do {
    iVar5 = smf::MidiFile::getNumEvents(midifile,0);
    if (iVar5 <= iVar4) {
      operator_delete(local_40);
      operator_delete(__s_00);
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
    if (verboseQ != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">>> ",4);
      pMVar8 = smf::MidiFile::operator[](midifile,0);
      pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
      poVar10 = (ostream *)
                std::ostream::operator<<
                          ((ostream *)&std::cout,
                           (uint)*(pMVar9->super_MidiMessage).
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    }
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_58,
               (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,&unused);
    pMVar8 = smf::MidiFile::operator[](midifile,0);
    pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
    bVar12 = *(pMVar9->super_MidiMessage).
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar8 = smf::MidiFile::operator[](midifile,0);
    pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
    bVar1 = *(pMVar9->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
             .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = smf::MidiFile::operator[](midifile,0);
    pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
    if (*(pMVar9->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start == 0xff) {
      pMVar8 = smf::MidiFile::operator[](midifile,0);
      pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
      if (((pMVar9->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[1] == 'Q') &&
         (setTempo(midifile,iVar4,&tempo), verboseQ != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"# New Tempo: ",0xd);
        poVar10 = std::ostream::_M_insert<double>(tempo);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      }
    }
    pMVar8 = smf::MidiFile::operator[](midifile,0);
    pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
    if ((*(pMVar9->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start & 0xf) != 9) {
      if (bVar12 < 0xf0) {
        bVar12 = bVar12 & 0xf0;
      }
      else {
        pMVar8 = smf::MidiFile::operator[](midifile,0);
        pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
        bVar12 = *(pMVar9->super_MidiMessage).
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      if (bVar12 < 0xb0) {
        if (bVar12 == 0x80) {
LAB_00112010:
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          bVar12 = (pMVar9->super_MidiMessage).
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start[1];
          uVar13 = (ulong)bVar12;
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          dVar2 = tempo;
          iVar5 = pMVar9->tick;
          iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar3 = getTime(iVar5,dVar2,iVar6);
          legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[1] = 1;
          dVar2 = *(double *)((long)__s_00 + uVar13 * 8);
          if (verboseQ == 0) {
            *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = dVar2;
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[1] = 1000.0;
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[2] = dVar3 - *(double *)((long)__s_00 + uVar13 * 8);
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[3] = (double)bVar12;
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[4] = (double)*(int *)((long)local_40 + uVar13 * 4);
            pMVar8 = smf::MidiFile::operator[](midifile,0);
            pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[5] =
                 (double)(*(pMVar9->super_MidiMessage).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start & 0xf);
            pMVar8 = smf::MidiFile::operator[](midifile,0);
            pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[6] = (double)pMVar9->track;
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[7] = (double)(bVar1 & 0xf);
          }
          else {
            poVar10 = std::ostream::_M_insert<double>(dVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tnote",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tdur=",5);
            poVar10 = std::ostream::_M_insert<double>
                                (dVar3 - *(double *)((long)__s_00 + uVar13 * 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tpch=",5);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,(uint)bVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tvel=",5);
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar10,*(int *)((long)local_40 + uVar13 * 4));
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tch=",4);
            pMVar8 = smf::MidiFile::operator[](midifile,0);
            pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar10,
                                 *(pMVar9->super_MidiMessage).
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xf);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\ttrack=",7);
            pMVar8 = smf::MidiFile::operator[](midifile,0);
            pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
            plVar7 = (long *)std::ostream::operator<<((ostream *)poVar10,pMVar9->track);
            std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
            std::ostream::put((char)plVar7);
            std::ostream::flush();
          }
        }
        else if (bVar12 == 0x90) {
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          if ((pMVar9->super_MidiMessage).
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[2] == '\0') goto LAB_00112010;
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          uVar13 = (ulong)(pMVar9->super_MidiMessage).
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start[1];
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          bVar1 = (pMVar9->super_MidiMessage).
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[2];
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          dVar2 = tempo;
          iVar5 = pMVar9->tick;
          iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar2 = getTime(iVar5,dVar2,iVar6);
          *(double *)((long)__s_00 + uVar13 * 8) = dVar2;
          *(uint *)((long)local_40 + uVar13 * 4) = (uint)bVar1;
        }
        goto LAB_00112353;
      }
      if (bVar12 == 0xb0) {
        pMVar8 = smf::MidiFile::operator[](midifile,0);
        pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
        legend_controller.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start
        [(pMVar9->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[1]] = 1;
        legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = 1;
        if (verboseQ == 0) {
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          dVar2 = tempo;
          iVar5 = pMVar9->tick;
          iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar2 = getTime(iVar5,dVar2,iVar6);
          *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start = dVar2;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[1] = 2000.0;
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[2] =
               (double)(pMVar9->super_MidiMessage).
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[1];
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[3] =
               (double)(pMVar9->super_MidiMessage).
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[2];
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[5] =
               (double)(*(pMVar9->super_MidiMessage).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start & 0xf);
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
LAB_00111fd6:
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[6] = (double)pMVar9->track;
          goto LAB_00112353;
        }
        pMVar8 = smf::MidiFile::operator[](midifile,0);
        pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
        dVar2 = tempo;
        iVar5 = pMVar9->tick;
        iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
        dVar2 = getTime(iVar5,dVar2,iVar6);
        poVar10 = std::ostream::_M_insert<double>(dVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tcontrol",8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\ttype=",6);
        pMVar8 = smf::MidiFile::operator[](midifile,0);
        pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar10,
                             (uint)(pMVar9->super_MidiMessage).
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tval=",5);
        pMVar8 = smf::MidiFile::operator[](midifile,0);
        pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar10,
                             (uint)(pMVar9->super_MidiMessage).
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start[2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tch=",4);
        pMVar8 = smf::MidiFile::operator[](midifile,0);
        pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar10,
                             *(pMVar9->super_MidiMessage).
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\ttrack=",7);
        pMVar8 = smf::MidiFile::operator[](midifile,0);
        pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
LAB_00112334:
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,pMVar9->track);
LAB_0011233f:
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      }
      else {
        if (bVar12 == 0xc0) {
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          legend_instr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[(pMVar9->super_MidiMessage).
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[1]] = 1;
          legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[3] = 1;
          if (verboseQ == 0) {
            pMVar8 = smf::MidiFile::operator[](midifile,0);
            pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
            dVar2 = tempo;
            iVar5 = pMVar9->tick;
            iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar2 = getTime(iVar5,dVar2,iVar6);
            *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = dVar2;
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[1] = 3000.0;
            pMVar8 = smf::MidiFile::operator[](midifile,0);
            pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[2] =
                 (double)(pMVar9->super_MidiMessage).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[1];
            pMVar8 = smf::MidiFile::operator[](midifile,0);
            pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[5] =
                 (double)(*(pMVar9->super_MidiMessage).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start & 0xf);
            pMVar8 = smf::MidiFile::operator[](midifile,0);
            pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
            goto LAB_00111fd6;
          }
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          dVar2 = tempo;
          iVar5 = pMVar9->tick;
          iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar2 = getTime(iVar5,dVar2,iVar6);
          poVar10 = std::ostream::_M_insert<double>(dVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tinstr",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tname=",6);
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          __s = GMinstrument
                [(pMVar9->super_MidiMessage).
                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[1]];
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
          }
          else {
            sVar11 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tnum=",5);
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               (uint)(pMVar9->super_MidiMessage).
                                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tch=",4);
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               *(pMVar9->super_MidiMessage).
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xf);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\ttrack=",7);
          pMVar8 = smf::MidiFile::operator[](midifile,0);
          pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
          goto LAB_00112334;
        }
        if (bVar12 == 0xff) {
          if (verboseQ == 0) {
            pMVar8 = smf::MidiFile::operator[](midifile,0);
            pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
            dVar2 = tempo;
            iVar5 = pMVar9->tick;
            iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar2 = getTime(iVar5,dVar2,iVar6);
            *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = dVar2;
          }
          else {
            pMVar8 = smf::MidiFile::operator[](midifile,0);
            pMVar9 = smf::MidiEventList::operator[](pMVar8,iVar4);
            dVar2 = tempo;
            iVar5 = pMVar9->tick;
            iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar2 = getTime(iVar5,dVar2,iVar6);
            poVar10 = std::ostream::_M_insert<double>(dVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
          }
          processMetaEvent(midifile,iVar4,&local_58);
          poVar10 = (ostream *)&std::cout;
          if (verboseQ == 0) goto LAB_00112353;
          goto LAB_0011233f;
        }
      }
LAB_00112353:
      if ((local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[1] != unused) ||
         (NAN(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[1]) || NAN(unused))) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(local_38,&local_58);
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void convertMidiFile(MidiFile& midifile, vector<vector<double> >& matlab) {
   midifile.absoluteTicks();
   midifile.joinTracks();
   vector<double> event(8);
   vector<double> ontimes(128);
   vector<int> onvelocities(128);
   int i;
   for (i=0; i<128; i++) {
      ontimes[i] = -1.0;
      onvelocities[i] = -1;
   }

   if (verboseQ) {
      cout << "-1\ttpq\t" << midifile.getTicksPerQuarterNote() << endl;
   }

   double offtime = 0.0;
   int key = 0;
   int vel = 0;

   for (i=0; i<midifile.getNumEvents(0); i++) {
      if (verboseQ) {
         cout << ">>> " << (int)midifile[0][i][0] << "\n";
      }
      event.assign(event.size(), unused);
      int command = midifile[0][i][0] & 0xf0;
      int channel = midifile[0][i][0] & 0x0f;

      // check for tempo indication
      if (midifile[0][i][0] == 0xff &&
                 midifile[0][i][1] == 0x51) {
         setTempo(midifile, i, tempo);
         if (verboseQ) {
            cout << "# New Tempo: " << tempo << "\n";
         }
      }

      if ((midifile[0][i][0] & 0x0f) == 0x09) {
          continue;
      }
      if (command == 0xf0) {
         command = midifile[0][i][0];
      }
      if (command == 0x90 && midifile[0][i][2] != 0) {
         // store note-on velocity and time
         key = midifile[0][i][1];
         vel = midifile[0][i][2];
         ontimes[key] = getTime(midifile[0][i].tick, tempo,
            midifile.getTicksPerQuarterNote());

         onvelocities[key] = vel;
      } else if (command == 0x90 || command == 0x80) {
         // note off command write to output
         key = midifile[0][i][1];
         offtime = getTime(midifile[0][i].tick, tempo,
            midifile.getTicksPerQuarterNote());
         legend_opcode[OP_NOTE/1000] = 1;

         if (verboseQ) {
            cout
              << ontimes[key]
              << "\tnote"
              << "\tdur=" << offtime - ontimes[key]
              << "\tpch=" << key
              << "\tvel=" << onvelocities[key]
              << "\tch="  << (midifile[0][i][0] & 0x0f)
              << "\ttrack=" << midifile[0][i].track
              << endl;
         } else {
            event[0] = ontimes[key];
            event[1] = OP_NOTE;
            event[2] = offtime - ontimes[key];
            event[3] = key;
            event[4] = onvelocities[key];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
            event[7] = channel;
         }
      } else if (command == 0xb0) {
         legend_controller[midifile[0][i][1]] = 1;
         legend_opcode[OP_CONTROL/1000] = 1;

         if (verboseQ) {
            cout << getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote())
                 << "\tcontrol"
                 << "\ttype="  << (int)midifile[0][i][1]
                 << "\tval="   << (int)midifile[0][i][2]
                 << "\tch="    << (midifile[0][i][0] & 0x0f)
                 << "\ttrack=" << midifile[0][i].track
                 << "\n";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                          midifile.getTicksPerQuarterNote());
            event[1] = OP_CONTROL;
            event[2] = (int)midifile[0][i][1];
            event[3] = (int)midifile[0][i][2];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
         }
      } else if (command == 0xc0) {
         legend_instr[midifile[0][i][1]] = 1;
         legend_opcode[OP_INSTR/1000] = 1;

         if (verboseQ) {
         cout << getTime(midifile[0][i].tick, tempo,
                    midifile.getTicksPerQuarterNote())
              << "\tinstr"
              << "\tname="  << GMinstrument[midifile[0][i][1]]
              << "\tnum="   << (int)midifile[0][i][1]
              << "\tch="    << (midifile[0][i][0] & 0x0f)
              << "\ttrack=" << midifile[0][i].track
              << "\n";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                    midifile.getTicksPerQuarterNote());
            event[1] = OP_INSTR;
            event[2] = (int)midifile[0][i][1];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
         }
      } else if (command == 0xff) {
         if (verboseQ) {
            cout << getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote())
                 << "\t";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote());
         }
         processMetaEvent(midifile, i, event);
         if (verboseQ) {
            cout << "\n";
         }
      }

      if (event[1] != unused) {
         matlab.push_back(event);
      }
   }
}